

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O1

void * mpp_dec_advanced_thread(void *data)

{
  MppMutexCond *__mutex;
  HalTaskInfo *task_00;
  MppDecImpl *dec;
  MppThread *this;
  pthread_mutex_t *__mutex_00;
  MppFrame pvVar1;
  MppBufSlots slots;
  void *pvVar2;
  MppPort port;
  MppThreadStatus MVar3;
  MPP_RET MVar4;
  RK_U32 RVar5;
  MppFrameFormat v;
  int iVar6;
  MppMeta pvVar7;
  MppBuffer pvVar8;
  RK_S64 RVar9;
  size_t sVar10;
  size_t sVar11;
  MppBufSlots slots_00;
  uint uVar12;
  bool bVar13;
  MppFrame frame;
  MppTask mpp_task;
  MppFrame tmp;
  MppPacket packet;
  DecTask task;
  undefined4 uVar14;
  MppFrame local_168;
  MppTask local_160;
  MppFrame local_158;
  MppPacket local_150;
  MppPort local_148;
  MppBufSlots local_140;
  MppBufSlots local_138;
  void *local_130;
  size_t local_128;
  MppBuffer local_120;
  MppPort local_118;
  sem_t *local_110;
  void **local_108;
  sem_t *local_100;
  pthread_cond_t *local_f8;
  DecTask local_f0;
  
  dec = *(MppDecImpl **)((long)data + 0xa8);
  this = dec->thread_parser;
  local_140 = dec->frame_slots;
  local_138 = dec->packet_slots;
  dec_task_init(&local_f0);
  local_148 = *(MppPort *)((long)data + 0x60);
  local_118 = *(MppPort *)((long)data + 0x68);
  local_160 = (MppTask)0x0;
  local_168 = (MppFrame)0x0;
  local_150 = (MppPacket)0x0;
  __mutex = this->mMutexCond;
  local_130 = data;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  MVar3 = MppThread::get_status(this,THREAD_WORK);
  bVar13 = MVar3 == MPP_THREAD_RUNNING;
  if (bVar13) {
    local_f8 = (pthread_cond_t *)&this->mMutexCond[0].mCondition;
    local_100 = (sem_t *)&dec->cmd_start;
    local_108 = &dec->param;
    local_110 = (sem_t *)&dec->cmd_done;
    do {
      MVar4 = check_task_wait(dec,&local_f0);
      if (MVar4 != MPP_OK) {
        MVar3 = this->mStatus[0];
        this->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_f8,(pthread_mutex_t *)__mutex);
        if (this->mStatus[0] == MPP_THREAD_WAITING) {
          this->mStatus[0] = MVar3;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (!bVar13) goto LAB_00148a54;
      if (dec->cmd_send == dec->cmd_recv) {
        if ((mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","mpp_pkt_in_rdy %d\n","mpp_dec_advanced_thread",
                     (ulong)(local_f0.status.val >> 1 & 1));
        }
        if ((local_f0.status.val & 2) == 0) {
          MVar4 = _mpp_port_poll("mpp_dec_advanced_thread",local_148,MPP_POLL_NON_BLOCK);
          if (MVar4 < MPP_OK) {
            local_f0.wait.val._0_1_ = local_f0.wait.val._0_1_ | 1;
            goto LAB_00148738;
          }
          if ((mpp_dec_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_dec","poll ready\n","mpp_dec_advanced_thread");
          }
          local_f0.status.val = local_f0.status.val | 2;
          local_f0.wait.val._0_1_ = local_f0.wait.val._0_1_ & 0xfe;
          MVar4 = _mpp_port_dequeue("mpp_dec_advanced_thread",local_148,&local_160);
          if ((MVar4 != MPP_OK) &&
             (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                         "mpp_dec_advanced_thread",0x3cd), (mpp_debug._3_1_ & 0x10) != 0))
          goto LAB_00148a89;
        }
        if ((mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","task in ready\n","mpp_dec_advanced_thread");
        }
        if ((local_160 == (MppTask)0x0) &&
           (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"mpp_task",
                       "mpp_dec_advanced_thread",0x3d1), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00148a89:
          abort();
        }
        mpp_task_meta_get_packet(local_160,KEY_INPUT_PACKET,&local_150);
        mpp_task_meta_get_frame(local_160,KEY_OUTPUT_FRAME,&local_168);
        if ((local_150 != (MppPacket)0x0 && local_168 == (MppFrame)0x0) &&
           ((pvVar7 = mpp_packet_get_meta(local_150), pvVar7 != (MppMeta)0x0 &&
            (mpp_meta_get_frame(pvVar7,KEY_OUTPUT_FRAME,&local_168), local_168 != (MppFrame)0x0))))
        {
          local_f0.status.val = local_f0.status.val | 0x400;
        }
        if ((local_150 == (MppPacket)0x0) || (local_168 == (MppFrame)0x0)) {
          _mpp_port_enqueue("mpp_dec_advanced_thread",local_148,local_160);
        }
        else {
          pvVar8 = mpp_packet_get_buffer(local_150);
          if (pvVar8 == (MppBuffer)0x0) {
            _mpp_log_l(4,"mpp_dec","line(%d): Error! Get no buffer from input packet\n",
                       "mpp_dec_advanced_thread",0x43d);
            mpp_frame_init(&local_168);
            mpp_frame_set_errinfo(local_168,1);
          }
          else {
            pvVar8 = mpp_packet_get_buffer(local_150);
            local_120 = mpp_frame_get_buffer(local_168);
            mpp_parser_prepare(dec->parser,local_150,&local_f0.info.dec);
            if (((local_f0.info._8_1_ & 1) == 0) || (local_f0.info.dec.valid != 0)) {
              if (local_f0.info.dec.input < 0) {
                mpp_buf_slot_get_unused(local_138,&local_f0.info.dec.input);
              }
              slots = local_138;
              mpp_buf_slot_set_prop(local_138,local_f0.info.dec.input,SLOT_BUFFER,pvVar8);
              mpp_buf_slot_set_flag(slots,local_f0.info.dec.input,SLOT_CODEC_READY);
              mpp_buf_slot_set_flag(slots,local_f0.info.dec.input,SLOT_HAL_INPUT);
              MVar4 = mpp_parser_parse(dec->parser,&local_f0.info.dec);
              slots_00 = local_140;
              if (MVar4 != MPP_OK) {
                _mpp_log_l(2,"mpp_dec","something wrong with mpp_parser_parse!\n",
                           "mpp_dec_advanced_thread");
                mpp_frame_set_errinfo(local_168,1);
                mpp_buf_slot_clr_flag(slots,local_f0.info.dec.input,SLOT_HAL_INPUT);
                goto LAB_0014859b;
              }
              if ((mpp_dec_debug & 0x20) != 0) {
                RVar5 = mpp_buf_slot_is_changed(local_140);
                _mpp_log_l(4,"mpp_dec","slot change %d\n","mpp_dec_advanced_thread",(ulong)RVar5);
              }
              RVar5 = mpp_buf_slot_is_changed(slots_00);
              if (RVar5 != 0) {
                sVar10 = mpp_buf_slot_get_size(slots_00);
                sVar11 = mpp_buffer_get_size_with_caller(local_120,"mpp_dec_advanced_thread");
                if ((mpp_dec_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_dec","change size required %d vs input %d\n",
                             "mpp_dec_advanced_thread",sVar10,sVar11);
                }
                slots_00 = local_140;
                local_128 = sVar11;
                if (sVar10 == sVar11) {
                  mpp_buf_slot_ready(local_140);
                }
                if (local_128 < sVar10) {
                  uVar14 = 0x415;
                  _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "slot_size <= buffer_size","mpp_dec_advanced_thread",0x415);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00148a89;
                  if (local_128 < sVar10) {
                    _mpp_log_l(2,"mpp_dec",
                               "required buffer size %d is larger than input buffer size %d\n",
                               "mpp_dec_advanced_thread",sVar10,local_128,uVar14);
                  }
                }
              }
              mpp_buf_slot_set_prop(slots_00,local_f0.info.dec.output,SLOT_BUFFER,local_120);
              if ((dec->info_updated == 0) && (dec->dev != (MppDev)0x0)) {
                local_158 = (MppFrame)0x0;
                mpp_buf_slot_get_prop(slots_00,local_f0.info.dec.output,SLOT_FRAME_PTR,&local_158);
                update_dec_hal_info(dec,local_158);
                dec->info_updated = 1;
              }
              task_00 = &local_f0.info;
              mpp_hal_reg_gen(dec->hal,task_00);
              mpp_hal_hw_start(dec->hal,task_00);
              mpp_hal_hw_wait(dec->hal,task_00);
              local_158 = (MppFrame)0x0;
              mpp_buf_slot_get_prop(slots_00,local_f0.info.dec.output,SLOT_FRAME_PTR,&local_158);
              pvVar1 = local_168;
              RVar5 = mpp_frame_get_width(local_158);
              mpp_frame_set_width(pvVar1,RVar5);
              pvVar1 = local_168;
              RVar5 = mpp_frame_get_height(local_158);
              mpp_frame_set_height(pvVar1,RVar5);
              pvVar1 = local_168;
              RVar5 = mpp_frame_get_hor_stride(local_158);
              mpp_frame_set_hor_stride(pvVar1,RVar5);
              pvVar1 = local_168;
              RVar5 = mpp_frame_get_ver_stride(local_158);
              mpp_frame_set_ver_stride(pvVar1,RVar5);
              pvVar1 = local_168;
              RVar5 = mpp_frame_get_hor_stride_pixel(local_158);
              mpp_frame_set_hor_stride_pixel(pvVar1,RVar5);
              pvVar1 = local_168;
              RVar9 = mpp_frame_get_pts(local_158);
              mpp_frame_set_pts(pvVar1,RVar9);
              pvVar1 = local_168;
              v = mpp_frame_get_fmt(local_158);
              mpp_frame_set_fmt(pvVar1,v);
              pvVar1 = local_168;
              RVar5 = mpp_frame_get_errinfo(local_158);
              mpp_frame_set_errinfo(pvVar1,RVar5);
              pvVar1 = local_168;
              sVar10 = mpp_frame_get_buf_size(local_158);
              mpp_frame_set_buf_size(pvVar1,sVar10);
              mpp_buf_slot_clr_flag(local_138,local_f0.info.dec.input,SLOT_HAL_INPUT);
              mpp_buf_slot_clr_flag(local_140,local_f0.info.dec.output,SLOT_HAL_OUTPUT);
              iVar6 = 0;
            }
            else {
              mpp_frame_set_eos(local_168,1);
LAB_0014859b:
              iVar6 = 0x1a;
            }
            if ((iVar6 != 0) && (iVar6 != 0x1a)) {
              return (void *)0x0;
            }
          }
          if ((local_f0.status.val & 0x400) == 0) {
            mpp_task_meta_set_packet(local_160,KEY_INPUT_PACKET,local_150);
            _mpp_port_enqueue("mpp_dec_advanced_thread",local_148,local_160);
            port = local_118;
            local_160 = (MppTask)0x0;
            _mpp_port_poll("mpp_dec_advanced_thread",local_118,MPP_POLL_BLOCK);
            _mpp_port_dequeue("mpp_dec_advanced_thread",port,&local_160);
            mpp_task_meta_set_frame(local_160,KEY_OUTPUT_FRAME,local_168);
            pvVar8 = mpp_frame_get_buffer(local_168);
            mpp_buffer_sync_begin_f(pvVar8,1,"mpp_dec_advanced_thread");
            _mpp_port_enqueue("mpp_dec_advanced_thread",port,local_160);
          }
          else {
            __mutex_00 = *(pthread_mutex_t **)((long)local_130 + 0x18);
            pvVar7 = mpp_frame_get_meta(local_168);
            if (pvVar7 != (MppMeta)0x0) {
              mpp_meta_set_packet(pvVar7,KEY_INPUT_PACKET,local_150);
            }
            if (((byte)mpp_debug & 2) != 0) {
              RVar9 = mpp_frame_get_pts(local_168);
              _mpp_log_l(4,"mpp_dec","output frame pts %lld\n",(char *)0x0,RVar9);
            }
            pthread_mutex_lock(__mutex_00);
            mpp_list::add_at_tail((mpp_list *)&__mutex_00->__data,&local_168,8);
            *(int *)((long)local_130 + 0x28) = *(int *)((long)local_130 + 0x28) + 1;
            pthread_cond_signal((pthread_cond_t *)(__mutex_00 + 1));
            pthread_mutex_unlock(__mutex_00);
            _mpp_port_enqueue("mpp_dec_advanced_thread",local_148,local_160);
            local_f0.status.val = local_f0.status.val & 0xfffffbff;
          }
          local_160 = (MppTask)0x0;
          local_150 = (MppPacket)0x0;
          local_168 = (MppFrame)0x0;
          dec_task_info_init(&local_f0.info);
        }
        local_f0.status.val = local_f0.status.val & 0xfffffffd;
      }
      else {
        if ((mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_advanced_thread",
                     (ulong)dec->cmd_recv,(ulong)dec->cmd);
        }
        sem_wait(local_100);
        MVar4 = mpp_dec_proc_cfg(dec,dec->cmd,dec->param);
        *dec->cmd_ret = MVar4;
        uVar12 = dec->cmd_recv + 1;
        dec->cmd_recv = uVar12;
        if ((mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_advanced_thread",
                     (ulong)uVar12,(ulong)dec->cmd_send);
        }
        dec->cmd = 0;
        *local_108 = (void *)0x0;
        local_108[1] = (MPP_RET *)0x0;
        sem_post(local_110);
      }
LAB_00148738:
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      MVar3 = MppThread::get_status(this,THREAD_WORK);
      bVar13 = MVar3 == MPP_THREAD_RUNNING;
    } while (bVar13);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_00148a54:
  dec_release_task_in_port(local_148);
  pvVar2 = local_130;
  dec_release_task_in_port(*(MppPort *)((long)local_130 + 0x50));
  dec_release_task_in_port(*(MppPort *)((long)pvVar2 + 0x58));
  return (void *)0x0;
}

Assistant:

void *mpp_dec_advanced_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;
    MppThread *thd_dec  = dec->thread_parser;
    DecTask task;   /* decoder task */
    DecTask *pTask = &task;
    dec_task_init(pTask);
    HalDecTask  *task_dec = &pTask->info.dec;
    MppPort input  = mpp->mMppInPort;
    MppPort output = mpp->mMppOutPort;
    MppTask mpp_task = NULL;
    MPP_RET ret = MPP_OK;
    MppFrame frame = NULL;
    MppPacket packet = NULL;

    while (1) {
        {
            AutoMutex autolock(thd_dec->mutex());
            if (MPP_THREAD_RUNNING != thd_dec->get_status())
                break;

            if (check_task_wait(dec, &task))
                thd_dec->wait();
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        // 1. check task in
        dec_dbg_detail("mpp_pkt_in_rdy %d\n", task.status.mpp_pkt_in_rdy);
        if (!task.status.mpp_pkt_in_rdy) {
            ret = mpp_port_poll(input, MPP_POLL_NON_BLOCK);
            if (ret < 0) {
                task.wait.dec_pkt_in = 1;
                continue;
            }

            dec_dbg_detail("poll ready\n");

            task.status.mpp_pkt_in_rdy = 1;
            task.wait.dec_pkt_in = 0;

            ret = mpp_port_dequeue(input, &mpp_task);
            mpp_assert(ret == MPP_OK);
        }
        dec_dbg_detail("task in ready\n");

        mpp_assert(mpp_task);

        mpp_task_meta_get_packet(mpp_task, KEY_INPUT_PACKET, &packet);
        mpp_task_meta_get_frame (mpp_task, KEY_OUTPUT_FRAME,  &frame);

        if (!frame && packet) {
            MppMeta meta = mpp_packet_get_meta(packet);

            if (meta) {
                mpp_meta_get_frame(meta, KEY_OUTPUT_FRAME, &frame);
                if (frame)
                    task.status.mpp_in_frm_at_pkt = 1;
            }
        }

        if (NULL == packet || NULL == frame) {
            mpp_port_enqueue(input, mpp_task);
            task.status.mpp_pkt_in_rdy = 0;
            continue;
        }

        if (mpp_packet_get_buffer(packet)) {
            /*
             * if there is available buffer in the input packet do decoding
             */
            MppBuffer input_buffer = mpp_packet_get_buffer(packet);
            MppBuffer output_buffer = mpp_frame_get_buffer(frame);

            mpp_parser_prepare(dec->parser, packet, task_dec);

            /*
             * We may find eos in prepare step and there will be no anymore vaild task generated.
             * So here we try push eos task to hal, hal will push all frame to display then
             * push a eos frame to tell all frame decoded
             */
            if (task_dec->flags.eos && !task_dec->valid) {
                mpp_frame_set_eos(frame, 1);
                goto DEC_OUT;
            }

            /*
             *  look for a unused packet slot index
             */
            if (task_dec->input < 0) {
                mpp_buf_slot_get_unused(packet_slots, &task_dec->input);
            }
            mpp_buf_slot_set_prop(packet_slots, task_dec->input, SLOT_BUFFER, input_buffer);
            mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
            mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);

            ret = mpp_parser_parse(dec->parser, task_dec);
            if (ret != MPP_OK) {
                mpp_err_f("something wrong with mpp_parser_parse!\n");
                mpp_frame_set_errinfo(frame, 1); /* 0 - OK; 1 - error */
                mpp_buf_slot_clr_flag(packet_slots, task_dec->input,  SLOT_HAL_INPUT);
                goto DEC_OUT;
            }

            dec_dbg_detail("slot change %d\n", mpp_buf_slot_is_changed(frame_slots));
            if (mpp_buf_slot_is_changed(frame_slots)) {
                size_t slot_size = mpp_buf_slot_get_size(frame_slots);
                size_t buffer_size = mpp_buffer_get_size(output_buffer);

                dec_dbg_detail("change size required %d vs input %d\n", slot_size, buffer_size);
                if (slot_size == buffer_size) {
                    mpp_buf_slot_ready(frame_slots);
                }

                mpp_assert(slot_size <= buffer_size);

                if (slot_size > buffer_size) {
                    mpp_err_f("required buffer size %d is larger than input buffer size %d\n",
                              slot_size, buffer_size);
                }
            }

            mpp_buf_slot_set_prop(frame_slots, task_dec->output, SLOT_BUFFER, output_buffer);
            // update codec info
            if (!dec->info_updated && dec->dev) {
                MppFrame tmp = NULL;

                mpp_buf_slot_get_prop(frame_slots, task_dec->output, SLOT_FRAME_PTR, &tmp);
                update_dec_hal_info(dec, tmp);
                dec->info_updated = 1;
            }
            // register genertation
            mpp_hal_reg_gen(dec->hal, &pTask->info);
            mpp_hal_hw_start(dec->hal, &pTask->info);
            mpp_hal_hw_wait(dec->hal, &pTask->info);

            MppFrame tmp = NULL;
            mpp_buf_slot_get_prop(frame_slots, task_dec->output, SLOT_FRAME_PTR, &tmp);
            mpp_frame_set_width(frame, mpp_frame_get_width(tmp));
            mpp_frame_set_height(frame, mpp_frame_get_height(tmp));
            mpp_frame_set_hor_stride(frame, mpp_frame_get_hor_stride(tmp));
            mpp_frame_set_ver_stride(frame, mpp_frame_get_ver_stride(tmp));
            mpp_frame_set_hor_stride_pixel(frame, mpp_frame_get_hor_stride_pixel(tmp));
            mpp_frame_set_pts(frame, mpp_frame_get_pts(tmp));
            mpp_frame_set_fmt(frame, mpp_frame_get_fmt(tmp));
            mpp_frame_set_errinfo(frame, mpp_frame_get_errinfo(tmp));
            mpp_frame_set_buf_size(frame, mpp_frame_get_buf_size(tmp));

            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,  SLOT_HAL_INPUT);
            mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);
        } else {
            /*
             * else init a empty frame for output
             */
            mpp_log_f("line(%d): Error! Get no buffer from input packet\n", __LINE__);
            mpp_frame_init(&frame);
            mpp_frame_set_errinfo(frame, 1);
        }

        /*
         * first clear output packet
         * then enqueue task back to input port
         * final user will release the mpp_frame they had input
         */
    DEC_OUT:
        if (task.status.mpp_in_frm_at_pkt) {
            mpp_list *list = mpp->mFrmOut;
            MppMeta meta = mpp_frame_get_meta(frame);

            if (meta)
                mpp_meta_set_packet(meta, KEY_INPUT_PACKET, packet);

            mpp_dbg_pts("output frame pts %lld\n", mpp_frame_get_pts(frame));

            list->lock();
            list->add_at_tail(&frame, sizeof(frame));
            mpp->mFramePutCount++;
            list->signal();
            list->unlock();

            mpp_port_enqueue(input, mpp_task);
            mpp_task = NULL;

            task.status.mpp_in_frm_at_pkt = 0;
        } else {
            mpp_task_meta_set_packet(mpp_task, KEY_INPUT_PACKET, packet);
            mpp_port_enqueue(input, mpp_task);
            mpp_task = NULL;

            // send finished task to output port
            mpp_port_poll(output, MPP_POLL_BLOCK);
            mpp_port_dequeue(output, &mpp_task);
            mpp_task_meta_set_frame(mpp_task, KEY_OUTPUT_FRAME, frame);
            mpp_buffer_sync_ro_begin(mpp_frame_get_buffer(frame));

            // setup output task here
            mpp_port_enqueue(output, mpp_task);
            mpp_task = NULL;
        }

        packet = NULL;
        frame = NULL;

        dec_task_info_init(&pTask->info);

        task.status.mpp_pkt_in_rdy = 0;
    }

    // clear remain task in output port
    dec_release_task_in_port(input);
    dec_release_task_in_port(mpp->mUsrInPort);
    dec_release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}